

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void term_timer(void *ctx,unsigned_long now)

{
  if ((*(char *)((long)ctx + 0x1128) == '\x01') && (*(unsigned_long *)((long)ctx + 0x1130) == now))
  {
    *(byte *)((long)ctx + 0x124) = *(byte *)((long)ctx + 0x124) ^ 1;
    *(undefined1 *)((long)ctx + 0x1128) = 0;
    term_schedule_tblink((Terminal *)ctx);
    *(undefined1 *)((long)ctx + 0x1119) = 1;
  }
  if ((*(char *)((long)ctx + 0x1129) == '\x01') && (*(unsigned_long *)((long)ctx + 0x1138) == now))
  {
    *(byte *)((long)ctx + 0x123) = *(byte *)((long)ctx + 0x123) ^ 1;
    *(undefined1 *)((long)ctx + 0x1129) = 0;
    term_schedule_cblink((Terminal *)ctx);
    *(undefined1 *)((long)ctx + 0x1119) = 1;
  }
  if ((*(char *)((long)ctx + 0x1a9) == '\x01') && (*(unsigned_long *)((long)ctx + 0x1b0) == now)) {
    *(undefined1 *)((long)ctx + 0x1a9) = 0;
    *(undefined1 *)((long)ctx + 0x1119) = 1;
  }
  if ((*(char *)((long)ctx + 0x111a) == '\x01') && (*(unsigned_long *)((long)ctx + 0x1120) == now))
  {
    *(undefined1 *)((long)ctx + 0x111a) = 0;
  }
  if (*(char *)((long)ctx + 0x1119) == '\x01') {
    term_update_callback(ctx);
    return;
  }
  return;
}

Assistant:

static void term_timer(void *ctx, unsigned long now)
{
    Terminal *term = (Terminal *)ctx;

    if (term->tblink_pending && now == term->next_tblink) {
        term->tblinker = !term->tblinker;
        term->tblink_pending = false;
        term_schedule_tblink(term);
        term->window_update_pending = true;
    }

    if (term->cblink_pending && now == term->next_cblink) {
        term->cblinker = !term->cblinker;
        term->cblink_pending = false;
        term_schedule_cblink(term);
        term->window_update_pending = true;
    }

    if (term->in_vbell && now == term->vbell_end) {
        term->in_vbell = false;
        term->window_update_pending = true;
    }

    if (term->window_update_cooldown &&
        now == term->window_update_cooldown_end) {
        term->window_update_cooldown = false;
    }

    if (term->window_update_pending)
        term_update_callback(term);
}